

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O0

int asn1_write_tagged_int(uchar **p,uchar *start,int val,int tag)

{
  long lVar1;
  int iVar2;
  size_t len_00;
  undefined4 in_ECX;
  int in_EDX;
  uchar **in_RSI;
  long *in_RDI;
  size_t len;
  size_t sVar3;
  
  len_00 = 0;
  do {
    sVar3 = len_00;
    if (*in_RDI - (long)in_RSI < 1) {
      return -0x6c;
    }
    len_00 = sVar3 + 1;
    lVar1 = *in_RDI;
    *in_RDI = lVar1 + -1;
    *(char *)(lVar1 + -1) = (char)in_EDX;
    in_EDX = in_EDX >> 8;
  } while (0 < in_EDX);
  if ((*(byte *)*in_RDI & 0x80) != 0) {
    if (*in_RDI - (long)in_RSI < 1) {
      return -0x6c;
    }
    lVar1 = *in_RDI;
    *in_RDI = lVar1 + -1;
    *(undefined1 *)(lVar1 + -1) = 0;
    len_00 = sVar3 + 2;
  }
  iVar2 = mbedtls_asn1_write_len_and_tag(in_RSI,(uchar *)CONCAT44(in_EDX,in_ECX),len_00,'\0');
  return iVar2;
}

Assistant:

static int asn1_write_tagged_int(unsigned char **p, const unsigned char *start, int val, int tag)
{
    size_t len = 0;

    do {
        if (*p - start < 1) {
            return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
        }
        len += 1;
        *--(*p) = val & 0xff;
        val >>= 8;
    } while (val > 0);

    if (**p & 0x80) {
        if (*p - start < 1) {
            return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
        }
        *--(*p) = 0x00;
        len += 1;
    }

    return mbedtls_asn1_write_len_and_tag(p, start, len, tag);
}